

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

void update_filter_type_cdf(MACROBLOCKD *xd,MB_MODE_INFO *mbmi,int dual_filter)

{
  InterpFilter val;
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  MACROBLOCKD *unaff_retaddr;
  InterpFilter filter;
  int ctx;
  int dir;
  int local_18;
  
  local_18 = 0;
  while ((local_18 < 2 && ((local_18 == 0 || (in_EDX != 0))))) {
    iVar1 = av1_get_pred_context_switchable_interp(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
    val = av1_extract_interp_filter(*(int_interpfilters *)(in_RSI + 0x14),local_18);
    update_cdf((aom_cdf_prob *)(*(long *)(in_RDI + 0x2998) + 0x36ea + (long)iVar1 * 8),val,3);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static inline void update_filter_type_cdf(const MACROBLOCKD *xd,
                                          const MB_MODE_INFO *mbmi,
                                          int dual_filter) {
  for (int dir = 0; dir < 2; ++dir) {
    if (dir && !dual_filter) break;
    const int ctx = av1_get_pred_context_switchable_interp(xd, dir);
    InterpFilter filter = av1_extract_interp_filter(mbmi->interp_filters, dir);
    update_cdf(xd->tile_ctx->switchable_interp_cdf[ctx], filter,
               SWITCHABLE_FILTERS);
  }
}